

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O1

uint logdir_open(logdir *ld,char *fn)

{
  stralloc *sa;
  unsigned_long *u;
  byte bVar1;
  char cVar2;
  taia *t;
  unsigned_long *puVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  char *x2;
  unsigned_long *u_00;
  stralloc *sa_00;
  stralloc *psVar10;
  long lVar11;
  char *pcVar12;
  unsigned_long port;
  unsigned_long local_70;
  stralloc *local_68;
  stralloc *local_60;
  taia *local_58;
  unsigned_long *local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  in_addr *local_38;
  
  iVar4 = open_read(fn);
  ld->fddir = iVar4;
  if (iVar4 == -1) {
    pcVar12 = "unable to open log directory";
LAB_001055b0:
    strerr_warn("svlogd: warning: ",pcVar12,": ",fn,": ",(char *)0x0,&strerr_sys);
    return 0;
  }
  coe(iVar4);
  iVar4 = fchdir(ld->fddir);
  if (iVar4 == -1) {
    logdir_close(ld);
    pcVar12 = "unable to change directory";
    goto LAB_001055b0;
  }
  iVar4 = open_append("lock");
  ld->fdlock = iVar4;
  if ((iVar4 == -1) || (iVar4 = lock_exnb(iVar4), iVar4 == -1)) {
    logdir_close(ld);
    strerr_warn("svlogd: warning: ","unable to lock directory",": ",fn,": ",(char *)0x0,&strerr_sys)
    ;
    iVar4 = fchdir(fdwdir);
    while (iVar4 == -1) {
      strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                  (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      sleep(3);
      iVar4 = fchdir(fdwdir);
    }
    return 0;
  }
  coe(ld->fdlock);
  ld->size = 0;
  ld->sizemax = 1000000;
  ld->nmin = 10;
  ld->nmax = 10;
  ld->tmax = 0;
  ld->name = fn;
  ld->ppid = 0;
  ld->match = '+';
  (ld->udpaddr).sin_port = 0;
  ld->udponly = 0;
  psVar10 = &ld->prefix;
  iVar4 = stralloc_copys(psVar10,"");
  while (iVar4 == 0) {
    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                ,(strerr *)0x0);
    sleep(3);
    iVar4 = stralloc_copys(psVar10,"");
  }
  sa = &ld->inst;
  local_60 = psVar10;
  iVar4 = stralloc_copys(sa,"");
  while (iVar4 == 0) {
    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                ,(strerr *)0x0);
    sleep(3);
    iVar4 = stralloc_copys(sa,"");
  }
  psVar10 = &ld->processor;
  iVar4 = stralloc_copys(psVar10,"");
  while (iVar4 == 0) {
    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
                ,(strerr *)0x0);
    sleep(3);
    iVar4 = stralloc_copys(psVar10,"");
  }
  iVar4 = openreadclose("config",&::sa,0x80);
  if (iVar4 != 0) {
    if (iVar4 == -1) {
      strerr_warn("svlogd: warning: ","unable to read config",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
    }
    local_68 = psVar10;
    if (verbose != 0) {
      strerr_warn("svlogd: info: ","read: ",ld->name,"/config",(char *)0x0,(char *)0x0,(strerr *)0x0
                 );
    }
    if (1 < ::sa.len) {
      u = &ld->sizemax;
      local_50 = &ld->nmin;
      local_40 = &ld->nmax;
      local_48 = &ld->tmax;
      local_58 = &ld->trotate;
      local_38 = &(ld->udpaddr).sin_addr;
      uVar9 = 1;
      iVar4 = 0;
      do {
        lVar11 = (long)iVar4;
        uVar5 = byte_chr(::sa.s + lVar11,::sa.len - iVar4,10);
        puVar3 = local_48;
        sa_00 = local_60;
        psVar10 = local_68;
        iVar8 = uVar5 + iVar4;
        ::sa.s[iVar8] = '\0';
        pcVar12 = ::sa.s;
        bVar1 = ::sa.s[lVar11];
        uVar7 = (ulong)(bVar1 - 0x2b);
        if (bVar1 - 0x2b < 0x3b) {
          if ((0x400000004000005U >> (uVar7 & 0x3f) & 1) == 0) {
            u_00 = local_50;
            if (uVar7 == 0x23) goto LAB_0010524f;
            if (uVar7 != 0x2a) goto code_r0x00105032;
            ld->udponly = 1;
            goto switchD_0010504e_caseD_75;
          }
          iVar4 = stralloc_catb(sa,::sa.s + lVar11,uVar5);
          while (iVar4 == 0) {
            strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
            sleep(3);
            iVar4 = stralloc_catb(sa,::sa.s + lVar11,uVar5);
          }
          while (iVar4 = stralloc_append(sa,""), iVar4 == 0) {
            strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
            sleep(3);
          }
        }
        else {
code_r0x00105032:
          switch(bVar1) {
          case 0x6e:
            u_00 = local_40;
LAB_0010524f:
            scan_ulong(::sa.s + (int)uVar9,u_00);
            break;
          case 0x6f:
          case 0x71:
          case 0x72:
            break;
          case 0x70:
            if (1 < (int)uVar5) {
              while (iVar4 = stralloc_copys(sa_00,::sa.s + (int)uVar9), iVar4 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
              }
              while (iVar4 = stralloc_append(sa_00,""), iVar4 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
                sa_00 = local_60;
              }
            }
            break;
          case 0x73:
            uVar9 = scan_ulong(::sa.s + (int)uVar9,u);
            if (pcVar12[uVar9 + iVar4 + 1] == 'k') {
              *u = *u << 10;
            }
            else if (pcVar12[uVar9 + iVar4 + 1] == 'm') {
              *u = *u << 0x14;
            }
            break;
          case 0x74:
            uVar9 = scan_ulong(::sa.s + (int)uVar9,local_48);
            t = local_58;
            cVar2 = pcVar12[uVar9 + iVar4 + 1];
            if (cVar2 == 'd') {
              lVar11 = 0x15180;
LAB_00105356:
              *puVar3 = lVar11 * *puVar3;
            }
            else {
              if (cVar2 == 'm') {
                lVar11 = 0x3c;
                goto LAB_00105356;
              }
              if (cVar2 == 'h') {
                lVar11 = 0xe10;
                goto LAB_00105356;
              }
            }
            if (*puVar3 != 0) {
              taia_uint(local_58,(uint)*puVar3);
              taia_add(t,&now,t);
              if ((tmaxflag == 0) || (iVar4 = taia_less(t,&trotate), iVar4 != 0)) {
                trotate.atto = t->atto;
                trotate.sec.x = (t->sec).x;
                trotate.nano = t->nano;
              }
              tmaxflag = 1;
            }
            break;
          case 0x75:
switchD_0010504e_caseD_75:
            uVar5 = ip4_scan(pcVar12 + lVar11 + 1,(char *)local_38);
            if (uVar5 == 0) {
              pcVar12 = ::sa.s + lVar11 + 1;
              x2 = "unable to scan ip address";
LAB_00105275:
              strerr_warn("svlogd: warning: ",x2,": ",pcVar12,(char *)0x0,(char *)0x0,(strerr *)0x0)
              ;
            }
            else {
              if (::sa.s[(int)(uVar9 + uVar5)] == ':') {
                scan_ulong(::sa.s + (int)uVar5 + lVar11 + 2,&local_70);
                if (local_70 == 0) {
                  pcVar12 = ::sa.s + (int)uVar5 + lVar11 + 2;
                  x2 = "unable to scan port number";
                  goto LAB_00105275;
                }
              }
              else {
                local_70 = 0x202;
              }
              (ld->udpaddr).sin_port = (ushort)local_70 << 8 | (ushort)local_70 >> 8;
            }
            break;
          default:
            if ((bVar1 == 0x21) && (1 < (int)uVar5)) {
              while (iVar4 = stralloc_copys(psVar10,::sa.s + (int)uVar9), iVar4 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
              }
              while (iVar4 = stralloc_append(psVar10,""), iVar4 == 0) {
                strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0
                            ,(char *)0x0,(strerr *)0x0);
                sleep(3);
                psVar10 = local_68;
              }
            }
          }
        }
        iVar4 = iVar8 + 1;
        uVar9 = iVar8 + 2;
      } while (uVar9 < ::sa.len);
    }
  }
  iVar4 = stat("current",(stat *)&st);
  if (iVar4 == -1) {
    piVar6 = __errno_location();
    if (*piVar6 != error_noent) {
      logdir_close(ld);
      strerr_warn("svlogd: warning: ","unable to stat current",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
      iVar4 = fchdir(fdwdir);
      while (iVar4 == -1) {
        strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
        sleep(3);
        iVar4 = fchdir(fdwdir);
      }
      return 0;
    }
  }
  else {
    if ((st.st_size == 0) || (((byte)st.st_mode & 0x40) != 0)) {
      ld->size = st.st_size;
      pcVar12 = "new: ";
      if (iVar4 == 0) {
        pcVar12 = "append: ";
      }
      goto LAB_00105621;
    }
    pcVar12 = ld->fnsave;
    ld->fnsave[0x19] = '.';
    ld->fnsave[0x1a] = 'u';
    ld->fnsave[0x1b] = '\0';
    do {
      do {
        taia_now(&now);
        fmt_taia(pcVar12,&now);
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar4 = stat(pcVar12,(stat *)&st);
      } while (iVar4 != -1);
    } while (*piVar6 != error_noent);
    iVar4 = rename("current",pcVar12);
    while (iVar4 == -1) {
      strerr_warn("svlogd: pausing: ","unable to rename current",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
      sleep(3);
      iVar4 = rename("current",pcVar12);
    }
    rmoldest(ld);
  }
  pcVar12 = "new: ";
LAB_00105621:
  iVar4 = open_append("current");
  ld->fdcur = iVar4;
  while (iVar4 == -1) {
    strerr_warn("svlogd: pausing: ","unable to open current",": ",ld->name,": ",(char *)0x0,
                &strerr_sys);
    sleep(3);
    iVar4 = open_append("current");
    ld->fdcur = iVar4;
  }
  coe(iVar4);
  iVar4 = fchmod(ld->fdcur,0x1a4);
  while (iVar4 == -1) {
    strerr_warn("svlogd: pausing: ","unable to set mode of current",": ",ld->name,": ",(char *)0x0,
                &strerr_sys);
    sleep(3);
    iVar4 = fchmod(ld->fdcur,0x1a4);
  }
  buffer_init(&ld->b,buffer_pwrite,(int)((ulong)((long)ld - (long)dir) >> 4) * -0x11111111,ld->btmp,
              (uint)buflen);
  if (verbose != 0) {
    strerr_warn("svlogd: info: ",pcVar12,ld->name,"/current",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  iVar4 = fchdir(fdwdir);
  while (iVar4 == -1) {
    strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",(char *)0x0
                ,(char *)0x0,(char *)0x0,&strerr_sys);
    sleep(3);
    iVar4 = fchdir(fdwdir);
  }
  return 1;
}

Assistant:

unsigned int logdir_open(struct logdir *ld, const char *fn) {
  int i;

  if ((ld->fddir =open_read(fn)) == -1) {
    warn2("unable to open log directory", (char*)fn);
    return(0);
  }
  coe(ld->fddir);
  if (fchdir(ld->fddir) == -1) {
    logdir_close(ld);
    warn2("unable to change directory", (char*)fn);
    return(0);
  }
  ld->fdlock =open_append("lock");
  if ((ld->fdlock == -1) || (lock_exnb(ld->fdlock) == -1)) {
    logdir_close(ld);
    warn2("unable to lock directory", (char*)fn);
    while (fchdir(fdwdir) == -1)
      pause1("unable to change to initial working directory");
    return(0);
  }
  coe(ld->fdlock);

  ld->size =0;
  ld->sizemax =1000000;
  ld->nmax =ld->nmin =10;
  ld->tmax =0;
  ld->name =(char*)fn;
  ld->ppid =0;
  ld->match ='+';
  ld->udpaddr.sin_port =0;
  ld->udponly =0;
  while (! stralloc_copys(&ld->prefix, "")) pause_nomem();
  while (! stralloc_copys(&ld->inst, "")) pause_nomem();
  while (! stralloc_copys(&ld->processor, "")) pause_nomem();

  /* read config */
  if ((i =openreadclose("config", &sa, 128)) == -1)
    warn2("unable to read config", ld->name);
  if (i != 0) {
    int len, c;
    unsigned long port;

    if (verbose) strerr_warn4(INFO, "read: ", ld->name, "/config", 0);
    for (i =0; i +1 < sa.len; ++i) {
      len =byte_chr(&sa.s[i], sa.len -i, '\n');
      sa.s[len +i] =0;
      switch(sa.s[i]) {
      case '\n':
      case '#':
         break;
      case '+':
      case '-':
      case 'e':
      case 'E':
        while (! stralloc_catb(&ld->inst, &sa.s[i], len)) pause_nomem();
        while (! stralloc_0(&ld->inst)) pause_nomem();
        break;
      case 's':
        /* Handle modifiers.  Do this the right way with breaks and all */
        switch (sa.s[scan_ulong(&sa.s[i +1], &ld->sizemax) +i +1]) {
          case 'm': ld->sizemax *= 1024 * 1024; break;
          case 'k': ld->sizemax *= 1024; break;
        }
        break;
      case 'n':
        scan_ulong(&sa.s[i +1], &ld->nmax);
        break;
      case 'N':
        scan_ulong(&sa.s[i +1], &ld->nmin);
        break;
      case 't':
        /* Handle modifiers.  Do this the right way with breaks and all */
        switch (sa.s[scan_ulong(&sa.s[i +1], &ld->tmax) +i +1]) {        
            case 'd': ld->tmax *= (24 * 60 * 60); break;
            case 'h': ld->tmax *= (60 * 60); break;
            case 'm': ld->tmax *= 60; break;
        }
        if (ld->tmax) {
          taia_uint(&ld->trotate, ld->tmax);
          taia_add(&ld->trotate, &now, &ld->trotate);
          if (! tmaxflag || taia_less(&ld->trotate, &trotate))
            trotate =ld->trotate;
          tmaxflag =1;
        }
        break;
      case '!':
        if (len > 1) {
          while (! stralloc_copys(&ld->processor, &sa.s[i +1])) pause_nomem();
          while (! stralloc_0(&ld->processor)) pause_nomem();
        }
        break;
      case 'U':
        ld->udponly =1;
      case 'u':
        if (! (c =ip4_scan(sa.s +i +1, (char *)&ld->udpaddr.sin_addr))) {
          warnx("unable to scan ip address", sa.s +i +1);
          break;
        }
        if (sa.s[i +1 +c] == ':') {
          scan_ulong(sa.s +i +c +2, &port);
          if (port == 0) {
            warnx("unable to scan port number", sa.s +i +c +2);
            break;
          }
        }
        else
          port =514;
        ld->udpaddr.sin_port =htons(port);
        break;
      case 'p':
        if (len > 1) {
          while (! stralloc_copys(&ld->prefix, &sa.s[i +1])) pause_nomem();
          while (! stralloc_0(&ld->prefix)) pause_nomem();
        }
        break;
      }
      i +=len;
    }
  }

  /* open current */
  if ((i =stat("current", &st)) != -1) {
    if (st.st_size && ! (st.st_mode & S_IXUSR)) {
      ld->fnsave[25] ='.'; ld->fnsave[26] ='u'; ld->fnsave[27] =0;
      do {
        taia_now(&now);
        fmt_taia(ld->fnsave, &now);
        errno =0;
      } while ((stat(ld->fnsave, &st) != -1) || (errno != error_noent));
      while (rename("current", ld->fnsave) == -1)
        pause2("unable to rename current", ld->name);
      rmoldest(ld);
      i =-1;
    }
    else
      ld->size =st.st_size;
  }
  else
    if (errno != error_noent) {
      logdir_close(ld);
      warn2("unable to stat current", ld->name);
      while (fchdir(fdwdir) == -1)
        pause1("unable to change to initial working directory");
      return(0);
    }
  while ((ld->fdcur =open_append("current")) == -1)
    pause2("unable to open current", ld->name);
  coe(ld->fdcur);
  while (fchmod(ld->fdcur, 0644) == -1)
    pause2("unable to set mode of current", ld->name);
  buffer_init(&ld->b, buffer_pwrite, ld -dir, ld->btmp, buflen);

  if (verbose) {
    if (i == 0) strerr_warn4(INFO, "append: ", ld->name, "/current", 0);
    else strerr_warn4(INFO, "new: ", ld->name, "/current", 0);
  }

  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}